

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_text.c
# Opt level: O0

void gatom_key(void *z,t_symbol *keysym,t_floatarg f)

{
  t_atom *ptVar1;
  _rtext *x_00;
  t_symbol *ptVar2;
  double dVar3;
  _rtext *t;
  t_atom *ap;
  char *buf;
  int local_30;
  int i;
  int bufsize;
  int c;
  t_gatom *x;
  t_symbol *ptStack_18;
  t_floatarg f_local;
  t_symbol *keysym_local;
  void *z_local;
  
  i = (int)f;
  _bufsize = (t_gatom *)z;
  x._4_4_ = f;
  ptStack_18 = keysym;
  keysym_local = (t_symbol *)z;
  ptVar1 = gatom_getatom((t_gatom *)z);
  x_00 = glist_findrtext(_bufsize->a_glist,&_bufsize->a_text);
  if ((i == 0) && (((byte)_bufsize->field_0x78 >> 4 & 1) == 0)) {
    if (x_00 == _bufsize->a_glist->gl_editor->e_textedfor) {
      rtext_activate(x_00,0);
    }
    _bufsize->field_0x78 = _bufsize->field_0x78 & 0xf7;
    gatom_reborder(_bufsize);
    gatom_redraw((t_gobj *)_bufsize,_bufsize->a_glist);
  }
  else if (i == 10) {
    _bufsize->field_0x78 = _bufsize->field_0x78 & 0xef;
    if (x_00 == _bufsize->a_glist->gl_editor->e_textedfor) {
      rtext_gettext(x_00,(char **)&ap,&local_30);
      ptVar2 = gensym("End");
      rtext_key(x_00,0,ptVar2);
      buf._4_4_ = 0;
      while ((buf._4_4_ < 3 &&
             (*(char *)((long)&ap->a_type + (long)((local_30 - buf._4_4_) + -1)) == '.'))) {
        buf._4_4_ = buf._4_4_ + 1;
      }
      while (buf._4_4_ != 0) {
        buf._4_4_ = buf._4_4_ + -1;
        rtext_key(x_00,8,&s_);
      }
      buf._4_4_ = buf._4_4_ + -1;
      rtext_gettext(x_00,(char **)&ap,&local_30);
      if (_bufsize->a_flavor == 1) {
        dVar3 = atof((char *)ap);
        (ptVar1->a_w).w_float = (float)dVar3;
      }
      else if (_bufsize->a_flavor == 2) {
        ptVar2 = gensym((char *)ap);
        (ptVar1->a_w).w_symbol = ptVar2;
      }
      else {
        text_setto(&_bufsize->a_text,_bufsize->a_glist,(char *)ap,local_30);
      }
      rtext_activate(x_00,0);
    }
    gatom_bang(_bufsize);
    gatom_senditup(_bufsize);
  }
  else {
    if (x_00 != _bufsize->a_glist->gl_editor->e_textedfor) {
      rtext_activate(x_00,1);
      rtext_key(x_00,0x2e,&s_);
      rtext_key(x_00,0x2e,&s_);
      rtext_key(x_00,0x2e,&s_);
      ptVar2 = gensym("Home");
      rtext_key(x_00,0,ptVar2);
    }
    if ((_bufsize->a_flavor == 2) || (_bufsize->a_flavor == 0)) {
      rtext_key(x_00,i,ptStack_18);
    }
    else if ((_bufsize->a_flavor == 1) &&
            (((((0x2f < i && (i < 0x3a)) || (i == 0x2e)) || ((i == 0x2d || (i == 0x2b)))) ||
             ((i == 0x65 || ((i == 0x45 || (i == 8)))))))) {
      rtext_key(x_00,i,ptStack_18);
    }
  }
  return;
}

Assistant:

void gatom_key(void *z, t_symbol *keysym, t_floatarg f)
{
    t_gatom *x = (t_gatom *)z;
    int c = f, bufsize, i;
    char *buf;
    t_atom *ap = gatom_getatom(x);

    t_rtext *t = glist_findrtext(x->a_glist, &x->a_text);
    if (c == 0 && !x->a_doubleclicked)
    {
        /* we're being notified that no more keys will come for this grab */
        if (t == x->a_glist->gl_editor->e_textedfor)
            rtext_activate(t, 0);
        x->a_grabbed = 0;
        gatom_reborder(x);
        gatom_redraw(&x->a_text.te_g, x->a_glist);
    }
    else if (c == '\n')
    {
        x->a_doubleclicked = 0;
        if (t == x->a_glist->gl_editor->e_textedfor)
        {
            rtext_gettext(t, &buf, &bufsize);
            rtext_key(t, 0, gensym("End"));
            for (i = 0; i < 3; i++)
                if (buf[bufsize-i-1] != '.')
                    break;
            while (i--)
                rtext_key(t, '\b', &s_);
            rtext_gettext(t, &buf, &bufsize);
            if (x->a_flavor == A_FLOAT)
                ap->a_w.w_float = atof(buf);
            else if (x->a_flavor == A_SYMBOL)
                ap->a_w.w_symbol = gensym(buf);
            else
                text_setto(&x->a_text, x->a_glist, buf, bufsize);
            rtext_activate(t, 0);
        }
        gatom_bang(x);
        gatom_senditup(x);
    }
    else
    {
        if (t != x->a_glist->gl_editor->e_textedfor)
        {
            rtext_activate(t, 1);
            rtext_key(t, '.', &s_);
            rtext_key(t, '.', &s_);
            rtext_key(t, '.', &s_);
            rtext_key(t, 0, gensym("Home"));
        }
        if (x->a_flavor == A_SYMBOL || x->a_flavor == A_LIST)
            rtext_key(t, c, keysym);  /* insert the character */
        else if (x->a_flavor == A_FLOAT && ((c >= '0' && c <= '9') || c == '.' ||
            c == '-' || c == '+' || c == 'e' || c == 'E' || c == '\b'))
                rtext_key(t, c, keysym);  /* insert the accepted characters */
    }
}